

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

int uv_os_environ(uv_env_item_t **envitems,int *count)

{
  uv_env_item_t *puVar1;
  char *__s;
  char *pcVar2;
  char *ptr;
  char *buf;
  uv_env_item_t *envitem;
  int local_28;
  int cnt;
  int j;
  int i;
  int *count_local;
  uv_env_item_t **envitems_local;
  
  *envitems = (uv_env_item_t *)0x0;
  *count = 0;
  cnt = 0;
  while (*(long *)(_environ + (long)cnt * 8) != 0) {
    cnt = cnt + 1;
  }
  puVar1 = (uv_env_item_t *)uv__calloc((long)cnt,0x10);
  *envitems = puVar1;
  if (*envitems == (uv_env_item_t *)0x0) {
    envitems_local._4_4_ = -0xc;
  }
  else {
    local_28 = 0;
    envitem._4_4_ = 0;
    while ((local_28 < cnt && (*(long *)(_environ + (long)local_28 * 8) != 0))) {
      __s = uv__strdup(*(char **)(_environ + (long)local_28 * 8));
      if (__s == (char *)0x0) {
        for (cnt = 0; cnt < envitem._4_4_; cnt = cnt + 1) {
          uv__free((*envitems)[envitem._4_4_].name);
        }
        uv__free(*envitems);
        *envitems = (uv_env_item_t *)0x0;
        *count = 0;
        return -0xc;
      }
      pcVar2 = strchr(__s,0x3d);
      if (pcVar2 == (char *)0x0) {
        uv__free(__s);
      }
      else {
        *pcVar2 = '\0';
        puVar1 = *envitems;
        puVar1[envitem._4_4_].name = __s;
        puVar1[envitem._4_4_].value = pcVar2 + 1;
        envitem._4_4_ = envitem._4_4_ + 1;
      }
      local_28 = local_28 + 1;
    }
    *count = envitem._4_4_;
    envitems_local._4_4_ = 0;
  }
  return envitems_local._4_4_;
}

Assistant:

int uv_os_environ(uv_env_item_t** envitems, int* count) {
  int i, j, cnt;
  uv_env_item_t* envitem;

  *envitems = NULL;
  *count = 0;

  for (i = 0; environ[i] != NULL; i++);

  *envitems = uv__calloc(i, sizeof(**envitems));

  if (*envitems == NULL)
    return UV_ENOMEM;

  for (j = 0, cnt = 0; j < i; j++) {
    char* buf;
    char* ptr;

    if (environ[j] == NULL)
      break;

    buf = uv__strdup(environ[j]);
    if (buf == NULL)
      goto fail;

    ptr = strchr(buf, '=');
    if (ptr == NULL) {
      uv__free(buf);
      continue;
    }

    *ptr = '\0';

    envitem = &(*envitems)[cnt];
    envitem->name = buf;
    envitem->value = ptr + 1;

    cnt++;
  }

  *count = cnt;
  return 0;

fail:
  for (i = 0; i < cnt; i++) {
    envitem = &(*envitems)[cnt];
    uv__free(envitem->name);
  }
  uv__free(*envitems);

  *envitems = NULL;
  *count = 0;
  return UV_ENOMEM;
}